

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

void __thiscall CLI::App::_process_extras(App *this)

{
  bool bVar1;
  size_t sVar2;
  undefined8 uVar3;
  element_type *this_00;
  long in_RDI;
  App_p *sub;
  iterator __end1;
  iterator __begin1;
  vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_> *__range1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_00000040;
  string *in_stack_00000048;
  ExtrasError *in_stack_00000050;
  size_t num_left_over;
  bool in_stack_00000087;
  App *in_stack_00000088;
  vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
  *in_stack_ffffffffffffff88;
  __normal_iterator<std::shared_ptr<CLI::App>_*,_std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>_>
  *in_stack_ffffffffffffff90;
  __normal_iterator<std::shared_ptr<CLI::App>_*,_std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>_>
  local_48;
  long local_40;
  undefined1 local_35;
  bool in_stack_ffffffffffffffcf;
  App *in_stack_ffffffffffffffd0;
  App *in_stack_fffffffffffffff0;
  
  if (((*(byte *)(in_RDI + 0x48) & 1) == 0) && ((*(byte *)(in_RDI + 0x4a) & 1) == 0)) {
    sVar2 = remaining_size(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcf);
    if (sVar2 != 0) {
      local_35 = 1;
      uVar3 = __cxa_allocate_exception(0x38);
      remaining_abi_cxx11_(in_stack_00000088,in_stack_00000087);
      ExtrasError::ExtrasError(in_stack_00000050,in_stack_00000048,in_stack_00000040);
      local_35 = 0;
      __cxa_throw(uVar3,&ExtrasError::typeinfo,ExtrasError::~ExtrasError);
    }
    in_stack_fffffffffffffff0 = (App *)0x0;
  }
  local_40 = in_RDI + 0x2c0;
  local_48._M_current =
       (shared_ptr<CLI::App> *)
       std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>::begin
                 (in_stack_ffffffffffffff88);
  std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>::end
            (in_stack_ffffffffffffff88);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_stack_ffffffffffffff90,
                       (__normal_iterator<std::shared_ptr<CLI::App>_*,_std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>_>
                        *)in_stack_ffffffffffffff88);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<CLI::App>_*,_std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>_>
    ::operator*(&local_48);
    this_00 = std::__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                         0x169432);
    sVar2 = count(this_00);
    if (sVar2 != 0) {
      std::__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x16944a
                );
      _process_extras(in_stack_fffffffffffffff0);
    }
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<CLI::App>_*,_std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>_>
    ::operator++(&local_48);
  }
  return;
}

Assistant:

CLI11_INLINE void App::_process_extras() {
    if(!(allow_extras_ || prefix_command_)) {
        std::size_t num_left_over = remaining_size();
        if(num_left_over > 0) {
            throw ExtrasError(name_, remaining(false));
        }
    }

    for(App_p &sub : subcommands_) {
        if(sub->count() > 0)
            sub->_process_extras();
    }
}